

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::Fixed16Case,_int>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  _Var1;
  tuple<testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  tVar2;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_false>
  _Var3;
  bool bVar4;
  char cVar5;
  __uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
  _Var6;
  
  bVar4 = AtEnd(this);
  if (bVar4) {
    __assert_fail("!AtEnd()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                  ,0x361,
                  "virtual void testing::internal::CartesianProductGenerator<google::protobuf::io::(anonymous namespace)::Fixed16Case, int>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1>>::Advance() [T = <google::protobuf::io::(anonymous namespace)::Fixed16Case, int>, I = std::integer_sequence<unsigned long, 0, 1>]"
                 );
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                        .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
                        super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>.
                        _M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
              + 0x18))();
  _Var1._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
       .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
       super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
       ._M_t;
  if ((_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)
      _Var1._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)
         *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
           *)&(this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
              .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
              super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_
              ._M_t.
              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
     ) {
    cVar5 = (**(code **)(*(long *)_Var1._M_t.
                                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                  .
                                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                                  ._M_head_impl + 0x30))();
    if (cVar5 == '\0') goto LAB_00b0763a;
  }
  _Var6.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        )(**(code **)(*(long *)(this->begin_).
                               super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                               .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
                               super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>.
                               _M_head_impl.impl_._M_t.
                               super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                     + 0x20))();
  tVar2.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         *)&(this->current_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
            .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
            super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
            _M_t.
            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
  .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
  super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
       = _Var6.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
         _M_head_impl;
  if (tVar2.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0) {
    (**(code **)(*(long *)tVar2.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_false>
              + 0x18))();
  _Var3._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_false>
       ._M_head_impl;
  if (_Var3._M_head_impl !=
      ((ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_false>
      )._M_head_impl) {
    (*(_Var3._M_head_impl)->_vptr_ParamIteratorInterface[6])();
  }
LAB_00b0763a:
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }